

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O1

int http_RecvMessage(SOCKINFO *info,http_parser_t *parser,http_method_t request_method,
                    int *timeout_secs,int *http_error_code)

{
  bool bVar1;
  uint uVar2;
  parse_status_t pVar3;
  char *buffer;
  int DbgLineNo;
  size_t __size;
  ulong buf_length;
  
  *http_error_code = 500;
  buffer = (char *)malloc(0x400);
  if (buffer != (char *)0x0) {
    if (request_method == HTTPMETHOD_UNKNOWN) {
      parser_request_init(parser);
    }
    else {
      parser_response_init(parser,request_method);
    }
    __size = 0x400;
    bVar1 = true;
    buf_length = 0;
    do {
      if (__size <= buf_length) {
        free(buffer);
        __size = __size * 2;
        buffer = (char *)malloc(__size);
        if (buffer == (char *)0x0) break;
      }
      uVar2 = sock_read(info,buffer,__size,timeout_secs);
      buf_length = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        if (uVar2 != 0) {
          *http_error_code = parser->http_error_code;
          DbgLineNo = 0x1d7;
          goto LAB_0010d4d7;
        }
        if (bVar1) {
          *http_error_code = 400;
          uVar2 = 0xffffff89;
          DbgLineNo = 0x1d1;
          goto LAB_0010d4d7;
        }
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x1c5,
                   "<<< (RECVD) <<<\n%s\n-----------------\n",(parser->msg).msg.buf);
        print_http_headers(&parser->msg);
        DbgLineNo = 0x1ca;
        goto LAB_0010d4d2;
      }
      pVar3 = parser_append(parser,buffer,buf_length);
      switch(pVar3) {
      case PARSE_SUCCESS:
        goto switchD_0010d398_caseD_0;
      case PARSE_INCOMPLETE_ENTITY:
        bVar1 = false;
        break;
      case PARSE_FAILURE:
      case PARSE_NO_MATCH:
        *http_error_code = parser->http_error_code;
        uVar2 = 0xffffff89;
        DbgLineNo = 0x1b1;
        goto LAB_0010d4d7;
      case PARSE_CONTINUE_1:
        DbgLineNo = 0x1ba;
        goto LAB_0010d4d2;
      }
    } while( true );
  }
  DbgLineNo = 0;
  buffer = (char *)0x0;
  uVar2 = 0xffffff98;
LAB_0010d4d7:
  free(buffer);
  if (uVar2 != 0) {
    UpnpPrintf(UPNP_ALL,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",DbgLineNo,
               "(http_RecvMessage): Error %d, http_error_code = %d.\n",(ulong)uVar2,*http_error_code
              );
  }
  return uVar2;
switchD_0010d398_caseD_0:
  uVar2 = 0;
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x19c,
             "<<< (RECVD) <<<\n%s\n-----------------\n",(parser->msg).msg.buf);
  print_http_headers(&parser->msg);
  DbgLineNo = 0x1ab;
  if (g_maxContentLength == 0) {
LAB_0010d4d2:
    uVar2 = 0;
  }
  else if ((uint)g_maxContentLength < parser->content_length) {
    *http_error_code = 0x19d;
    uVar2 = 0xfffffe06;
    DbgLineNo = 0x1a7;
  }
  goto LAB_0010d4d7;
}

Assistant:

int http_RecvMessage(SOCKINFO *info,
	http_parser_t *parser,
	http_method_t request_method,
	int *timeout_secs,
	int *http_error_code)
{
	int ret = UPNP_E_SUCCESS;
	int line = 0;
	parse_status_t status;
	int num_read = 0;
	int ok_on_close = 0;
	char *buf;
	size_t buf_len = 1024;

	*http_error_code = HTTP_INTERNAL_SERVER_ERROR;
	buf = malloc(buf_len);
	if (!buf) {
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}
	if (request_method == (http_method_t)HTTPMETHOD_UNKNOWN) {
		parser_request_init(parser);
	} else {
		parser_response_init(parser, request_method);
	}

	while (1) {
		/* Double the bet if needed */
		/* We should have already exited the loop if the value was <= 0
		 * so the cast is safe */
		if ((size_t)num_read >= buf_len) {
			free(buf);
			buf_len = 2 * buf_len;
			buf = malloc(buf_len);
			if (!buf) {
				ret = UPNP_E_OUTOF_MEMORY;
				goto ExitFunction;
			}
		}
		num_read = sock_read(info, buf, buf_len, timeout_secs);
		if (num_read > 0) {
			/* got data */
			status = parser_append(parser, buf, (size_t)num_read);
			switch (status) {
			case PARSE_SUCCESS:
				UpnpPrintf(UPNP_INFO,
					HTTP,
					__FILE__,
					__LINE__,
					"<<< (RECVD) "
					"<<<\n%s\n-----------------\n",
					parser->msg.msg.buf);
				print_http_headers(&parser->msg);
				if (g_maxContentLength > 0 &&
					parser->content_length >
						(unsigned int)
							g_maxContentLength) {
					*http_error_code =
						HTTP_REQ_ENTITY_TOO_LARGE;
					line = __LINE__;
					ret = UPNP_E_OUTOF_BOUNDS;
					goto ExitFunction;
				}
				line = __LINE__;
				ret = 0;
				goto ExitFunction;
			case PARSE_FAILURE:
			case PARSE_NO_MATCH:
				*http_error_code = parser->http_error_code;
				line = __LINE__;
				ret = UPNP_E_BAD_HTTPMSG;
				goto ExitFunction;
			case PARSE_INCOMPLETE_ENTITY:
				/* read until close */
				ok_on_close = 1;
				break;
			case PARSE_CONTINUE_1:
				/* Web post request. */
				line = __LINE__;
				ret = PARSE_SUCCESS;
				goto ExitFunction;
			default:
				break;
			}
		} else if (num_read == 0) {
			if (ok_on_close) {
				UpnpPrintf(UPNP_INFO,
					HTTP,
					__FILE__,
					__LINE__,
					"<<< (RECVD) "
					"<<<\n%s\n-----------------\n",
					parser->msg.msg.buf);
				print_http_headers(&parser->msg);
				line = __LINE__;
				ret = 0;
				goto ExitFunction;
			} else {
				/* partial msg */
				*http_error_code =
					HTTP_BAD_REQUEST; /* or response */
				line = __LINE__;
				ret = UPNP_E_BAD_HTTPMSG;
				goto ExitFunction;
			}
		} else {
			*http_error_code = parser->http_error_code;
			line = __LINE__;
			ret = num_read;
			goto ExitFunction;
		}
	}

ExitFunction:
	free(buf);
	if (ret != UPNP_E_SUCCESS) {
		UpnpPrintf(UPNP_ALL,
			HTTP,
			__FILE__,
			line,
			"(http_RecvMessage): Error %d, http_error_code = %d.\n",
			ret,
			*http_error_code);
	}

	return ret;
}